

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_reader_init(mz_zip_archive *pZip,mz_uint64 size,mz_uint32 flags)

{
  mz_bool mVar1;
  mz_uint32 flags_local;
  mz_uint64 size_local;
  mz_zip_archive *pZip_local;
  
  if ((pZip == (mz_zip_archive *)0x0) || (pZip->m_pRead == (mz_file_read_func)0x0)) {
    pZip_local._4_4_ = 0;
  }
  else {
    mVar1 = mz_zip_reader_init_internal(pZip,flags);
    if (mVar1 == 0) {
      pZip_local._4_4_ = 0;
    }
    else {
      pZip->m_archive_size = size;
      mVar1 = mz_zip_reader_read_central_dir(pZip,flags);
      if (mVar1 == 0) {
        mz_zip_reader_end(pZip);
        pZip_local._4_4_ = 0;
      }
      else {
        pZip_local._4_4_ = 1;
      }
    }
  }
  return pZip_local._4_4_;
}

Assistant:

mz_bool mz_zip_reader_init(mz_zip_archive *pZip, mz_uint64 size,
                           mz_uint32 flags) {
  if ((!pZip) || (!pZip->m_pRead))
    return MZ_FALSE;
  if (!mz_zip_reader_init_internal(pZip, flags))
    return MZ_FALSE;
  pZip->m_archive_size = size;
  if (!mz_zip_reader_read_central_dir(pZip, flags)) {
    mz_zip_reader_end(pZip);
    return MZ_FALSE;
  }
  return MZ_TRUE;
}